

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableGrow(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  bool bVar1;
  u32 value;
  uint count;
  Result result;
  RefVec *this_00;
  const_reference pvVar2;
  Table *pTVar3;
  Ref ref_00;
  Ref ref;
  uint delta;
  u32 old_size;
  undefined1 local_30 [8];
  Ptr table;
  Ptr *out_trap_local;
  Thread *this_local;
  
  store = this->store_;
  table.root_index_ = (Index)out_trap;
  this_00 = Instance::tables(this->inst_);
  pvVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_30,store,(Ref)pvVar2->index);
  pTVar3 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_30);
  value = Table::size(pTVar3);
  count = Pop<unsigned_int>(this);
  ref_00 = Pop<wabt::interp::Ref>(this);
  pTVar3 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_30);
  result = Table::Grow(pTVar3,this->store_,count,ref_00);
  bVar1 = Failed(result);
  if (bVar1) {
    Push<int>(this,-1);
  }
  else {
    Push<unsigned_int>(this,value);
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_30);
  return Ok;
}

Assistant:

RunResult Thread::DoTableGrow(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  u32 old_size = table->size();
  auto delta = Pop<u32>();
  auto ref = Pop<Ref>();
  if (Failed(table->Grow(store_, delta, ref))) {
    Push<s32>(-1);
  } else {
    Push<u32>(old_size);
  }
  return RunResult::Ok;
}